

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::Layer::Layer(Layer *this)

{
  (this->super_Group).super_Object.field_0.mPtr = (char *)0x0;
  (this->super_Group).super_Object.field_0.mData._type = Layer;
  *(byte *)((long)&(this->super_Group).super_Object.field_0 + 0xf) =
       *(byte *)((long)&(this->super_Group).super_Object.field_0 + 0xf) & 0xf8 | 5;
  (this->super_Group).mChildren.
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Group).mChildren.
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Group).mChildren.
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Group).mTransform = (Transform *)0x0;
  this->mMatteType = None;
  this->mLayerType = Null;
  this->mBlendMode = Normal;
  this->mHasRoundedCorner = false;
  this->mHasPathOperator = false;
  this->mHasMask = false;
  this->mHasMask = false;
  this->mHasRepeater = false;
  this->mHasGradient = false;
  this->mAutoOrient = false;
  (this->mLayerSize).mw = 0;
  (this->mLayerSize).mh = 0;
  this->mParentId = -1;
  this->mId = -1;
  this->mTimeStreatch = 1.0;
  this->mInFrame = 0;
  this->mOutFrame = 0;
  this->mStartFrame = 0;
  (this->mExtra)._M_t.
  super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
  ._M_t.
  super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
  .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl =
       (Extra *)0x0;
  return;
}

Assistant:

explicit Object(Object::Type type) : mPtr(nullptr)
    {
        mData._type = type;
        mData._static = true;
        mData._shortString = true;
        mData._hidden = false;
    }